

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  byte tag;
  TString *key;
  TValue *io;
  TString *x_;
  
  key = luaS_new(L,k);
  tag = 0x30;
  if (t->tt_ == 'E') {
    tag = luaH_getstr((Table *)(t->value_).gc,key,&((L->top).p)->val);
  }
  pSVar1 = (L->top).p;
  if ((tag & 0xf) == 0) {
    *(TString **)pSVar1 = key;
    (pSVar1->val).tt_ = key->tt | 0x40;
    pSVar1 = (L->top).p;
    (L->top).p = pSVar1 + 1;
    tag = luaV_finishget(L,t,&pSVar1->val,pSVar1,tag);
  }
  else {
    (L->top).p = pSVar1 + 1;
  }
  return (int)(tag & 0xf);
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  lu_byte tag;
  TString *str = luaS_new(L, k);
  luaV_fastget(t, str, s2v(L->top.p), luaH_getstr, tag);
  if (!tagisempty(tag))
    api_incr_top(L);
  else {
    setsvalue2s(L, L->top.p, str);
    api_incr_top(L);
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  }
  lua_unlock(L);
  return novariant(tag);
}